

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O0

int secp256k1_ecdsa_sig_parse(secp256k1_scalar *rr,secp256k1_scalar *rs,uchar *sig,size_t size)

{
  int iVar1;
  size_t local_40;
  size_t rlen;
  uchar *sigend;
  size_t size_local;
  uchar *sig_local;
  secp256k1_scalar *rs_local;
  secp256k1_scalar *rr_local;
  
  rlen = (size_t)(sig + size);
  if ((sig == (uchar *)rlen) || (size_local = (size_t)(sig + 1), *sig != '0')) {
    rr_local._4_4_ = 0;
  }
  else {
    sigend = (uchar *)size;
    sig_local = (uchar *)rs;
    rs_local = rr;
    iVar1 = secp256k1_der_read_len(&local_40,(uchar **)&size_local,(uchar *)rlen);
    if (iVar1 == 0) {
      rr_local._4_4_ = 0;
    }
    else if (local_40 == rlen - size_local) {
      iVar1 = secp256k1_der_parse_integer(rs_local,(uchar **)&size_local,(uchar *)rlen);
      if (iVar1 == 0) {
        rr_local._4_4_ = 0;
      }
      else {
        iVar1 = secp256k1_der_parse_integer
                          ((secp256k1_scalar *)sig_local,(uchar **)&size_local,(uchar *)rlen);
        if (iVar1 == 0) {
          rr_local._4_4_ = 0;
        }
        else if (size_local == rlen) {
          rr_local._4_4_ = 1;
        }
        else {
          rr_local._4_4_ = 0;
        }
      }
    }
    else {
      rr_local._4_4_ = 0;
    }
  }
  return rr_local._4_4_;
}

Assistant:

static int secp256k1_ecdsa_sig_parse(secp256k1_scalar *rr, secp256k1_scalar *rs, const unsigned char *sig, size_t size) {
    const unsigned char *sigend = sig + size;
    size_t rlen;
    if (sig == sigend || *(sig++) != 0x30) {
        /* The encoding doesn't start with a constructed sequence (X.690-0207 8.9.1). */
        return 0;
    }
    if (secp256k1_der_read_len(&rlen, &sig, sigend) == 0) {
        return 0;
    }
    if (rlen != (size_t)(sigend - sig)) {
        /* Tuple exceeds bounds or garage after tuple. */
        return 0;
    }

    if (!secp256k1_der_parse_integer(rr, &sig, sigend)) {
        return 0;
    }
    if (!secp256k1_der_parse_integer(rs, &sig, sigend)) {
        return 0;
    }

    if (sig != sigend) {
        /* Trailing garbage inside tuple. */
        return 0;
    }

    return 1;
}